

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O0

CSHA512 * (anonymous_namespace)::operator<<(CSHA512 *hasher,int **data)

{
  size_t in_RSI;
  CSHA512 *in_RDI;
  long in_FS_OFFSET;
  CSHA512 *this;
  
  this = *(CSHA512 **)(in_FS_OFFSET + 0x28);
  CSHA512::Write(this,(uchar *)in_RDI,in_RSI);
  if (*(CSHA512 **)(in_FS_OFFSET + 0x28) == this) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CSHA512& operator<<(CSHA512& hasher, const T& data) {
    static_assert(!std::is_same<typename std::decay<T>::type, char*>::value, "Calling operator<<(CSHA512, char*) is probably not what you want");
    static_assert(!std::is_same<typename std::decay<T>::type, unsigned char*>::value, "Calling operator<<(CSHA512, unsigned char*) is probably not what you want");
    static_assert(!std::is_same<typename std::decay<T>::type, const char*>::value, "Calling operator<<(CSHA512, const char*) is probably not what you want");
    static_assert(!std::is_same<typename std::decay<T>::type, const unsigned char*>::value, "Calling operator<<(CSHA512, const unsigned char*) is probably not what you want");
    hasher.Write((const unsigned char*)&data, sizeof(data));
    return hasher;
}